

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep.c
# Opt level: O2

int sprkStep_Init(ARKodeMem ark_mem,int init_type)

{
  int iVar1;
  ARKodeSPRKStepMem pAVar2;
  int iVar3;
  ARKodeSPRKTable pAVar4;
  ARKODE_SPRKMethodID id;
  ARKodeSPRKStepMem step_mem;
  
  step_mem = (ARKodeSPRKStepMem)0x0;
  iVar3 = sprkStep_AccessStepMem(ark_mem,"sprkStep_Init",&step_mem);
  pAVar2 = step_mem;
  if (iVar3 == 0) {
    if (init_type == 0) {
      pAVar4 = step_mem->method;
      if (pAVar4 == (ARKodeSPRKTable)0x0) {
        switch(step_mem->q) {
        case 1:
          id = ARKODE_MIN_SPRK_NUM;
          break;
        case 2:
          id = ARKODE_SPRK_LEAPFROG_2_2;
          break;
        case 3:
          id = ARKODE_SPRK_MCLACHLAN_3_3;
          break;
        default:
          id = ARKODE_SPRK_MCLACHLAN_4_4;
          break;
        case 5:
          id = ARKODE_SPRK_MCLACHLAN_5_6;
          break;
        case 6:
          id = ARKODE_SPRK_YOSHIDA_6_8;
          break;
        case 7:
        case 8:
          id = ARKODE_SPRK_SUZUKI_UMENO_8_16;
          break;
        case 9:
        case 10:
          id = ARKODE_MAX_SPRK_NUM;
        }
        pAVar4 = ARKodeSPRKTable_Load(id);
        pAVar2->method = pAVar4;
      }
    }
    else {
      if (init_type == 1) {
        return 0;
      }
      pAVar4 = step_mem->method;
    }
    iVar1 = pAVar4->q;
    if (iVar1 < 2) {
      if ((iVar1 == 1) && (1 < ark_mem->interp_degree)) {
        ark_mem->interp_degree = 1;
      }
    }
    else if (iVar1 <= ark_mem->interp_degree) {
      ark_mem->interp_degree = iVar1 + -1;
    }
  }
  return iVar3;
}

Assistant:

int sprkStep_Init(ARKodeMem ark_mem, int init_type)
{
  ARKodeSPRKStepMem step_mem = NULL;
  int retval                 = 0;

  /* access ARKodeSPRKStepMem structure */
  retval = sprkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* immediately return if reset */
  if (init_type == RESET_INIT) { return (ARK_SUCCESS); }

  /* initializations/checks for (re-)initialization call */
  if (init_type == FIRST_INIT)
  {
    if (!step_mem->method)
    {
      switch (step_mem->q)
      {
      case 1:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_1);
        break;
      case 2:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_2);
        break;
      case 3:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_3);
        break;
      case 4:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_4);
        break;
      case 5:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_5);
        break;
      case 6:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_6);
        break;
      case 7:
      case 8:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_8);
        break;
      case 9:
      case 10:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_10);
        break;
      default:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_4);
        break;
      }
    }
  }

  /* Override the interpolant degree (if needed), used in arkInitialSetup */
  if (step_mem->method->q > 1 &&
      ark_mem->interp_degree > (step_mem->method->q - 1))
  {
    /* Limit max degree to at most one less than the method global order */
    ark_mem->interp_degree = step_mem->method->q - 1;
  }
  else if (step_mem->method->q == 1 && ark_mem->interp_degree > 1)
  {
    /* Allow for linear interpolant with first order methods to ensure
       solution values are returned at the time interval end points */
    ark_mem->interp_degree = 1;
  }

  return (ARK_SUCCESS);
}